

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_7.hpp
# Opt level: O2

int __thiscall
jsoncons::jsonschema::draft7::
schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::init(schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
       *this,EVP_PKEY_CTX *ctx)

{
  unordered_map<_4822c21c_> *puVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_(const_jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>_>_>_&)>_>,_false,_true>,_bool>
  pVar2;
  evaluation_options local_70;
  
  puVar1 = &this->keyword_factory_map_;
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[5],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_1_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"type",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[16],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_2_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"contentEncoding",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[17],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_3_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"contentMediaType",&local_70);
  evaluation_options::evaluation_options
            (&local_70,
             &(this->
              super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              ).options_);
  evaluation_options::~evaluation_options(&local_70);
  if (local_70.require_format_validation_ == true) {
    local_70.default_version_._M_dataplus._M_p = (pointer)this;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[7],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_4_>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)puVar1,"format");
  }
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[8],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_5_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"pattern",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[9],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_6_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"maxItems",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[9],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_7_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"minItems",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[14],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_8_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"maxProperties",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[14],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_9_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"minProperties",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[9],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_10_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"contains",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[12],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_11_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"uniqueItems",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[10],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_12_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"maxLength",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[10],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_13_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"minLength",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[4],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_14_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"not",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[8],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_15_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"maximum",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[17],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_16_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"exclusiveMaximum",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[8],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_17_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"minimum",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[17],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_18_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"exclusiveMinimum",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[11],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_19_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"multipleOf",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[6],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_20_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"const",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[5],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_21_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"enum",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[6],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_22_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"allOf",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[6],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_23_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"anyOf",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[6],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_24_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"oneOf",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[13],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_25_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"dependencies",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<char_const(&)[14],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_26_>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"propertyNames",&local_70);
  local_70.default_version_._M_dataplus._M_p = (pointer)this;
  pVar2 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<char_const(&)[9],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_27_>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)puVar1,"required",&local_70);
  return (int)pVar2.first.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_(const_jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>_>_>_&)>_>,_true>
              ._M_cur;
}

Assistant:

void init()
        {
            keyword_factory_map_.emplace("type", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_type_validator(context, sch, parent);});
            keyword_factory_map_.emplace("contentEncoding", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&)
            {
                return factory_.make_content_encoding_validator(context, sch, parent);}
            );
            keyword_factory_map_.emplace("contentMediaType", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_content_media_type_validator(context, sch, parent);});
            if (this->options().require_format_validation())
            {
                keyword_factory_map_.emplace("format", 
                    [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_format_validator(context, sch, parent);});
            }
#if defined(JSONCONS_HAS_STD_REGEX)
            keyword_factory_map_.emplace("pattern", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_pattern_validator(context, sch, parent);});
#endif
            keyword_factory_map_.emplace("maxItems", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_max_items_validator(context, sch, parent);});
            keyword_factory_map_.emplace("minItems", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_min_items_validator(context, sch, parent);});
            keyword_factory_map_.emplace("maxProperties", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_max_properties_validator(context, sch, parent);});
            keyword_factory_map_.emplace("minProperties", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_min_properties_validator(context, sch, parent);});
            keyword_factory_map_.emplace("contains", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type& anchor_dict)
                        {return factory_.make_contains_validator(context, sch, parent, anchor_dict);});
            keyword_factory_map_.emplace("uniqueItems", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_unique_items_validator(context, sch, parent);});
            keyword_factory_map_.emplace("maxLength", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_max_length_validator(context, sch, parent);});
            keyword_factory_map_.emplace("minLength", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_min_length_validator(context, sch, parent);});
            keyword_factory_map_.emplace("not", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type& anchor_dict){return factory_.make_not_validator(context, sch, parent, anchor_dict);});
            keyword_factory_map_.emplace("maximum", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_maximum_validator(context, sch, parent);});
            keyword_factory_map_.emplace("exclusiveMaximum", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_exclusive_maximum_validator(context, sch, parent);});
            keyword_factory_map_.emplace("minimum", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_minimum_validator(context, sch, parent);});
            keyword_factory_map_.emplace("exclusiveMinimum", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_exclusive_minimum_validator(context, sch, parent);});
            keyword_factory_map_.emplace("multipleOf", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_multiple_of_validator(context, sch, parent);});
            keyword_factory_map_.emplace("const", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_const_validator(context, sch, parent);});
            keyword_factory_map_.emplace("enum", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_enum_validator(context, sch, parent);});
            keyword_factory_map_.emplace("allOf", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type& anchor_dict){return factory_.make_all_of_validator(context, sch, parent, anchor_dict);});
            keyword_factory_map_.emplace("anyOf", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type& anchor_dict){return factory_.make_any_of_validator(context, sch, parent, anchor_dict);});
            keyword_factory_map_.emplace("oneOf", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type& anchor_dict){return factory_.make_one_of_validator(context, sch, parent, anchor_dict);});
            keyword_factory_map_.emplace("dependencies", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type& anchor_dict){return factory_.make_dependencies_validator(context, sch, parent, anchor_dict);});
            keyword_factory_map_.emplace("propertyNames", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type& anchor_dict){return factory_.make_property_names_validator(context, sch, parent, anchor_dict);});
            keyword_factory_map_.emplace("required", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_required_validator(context, sch, parent);});
        }